

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.cpp
# Opt level: O1

bool __thiscall
llbuild::buildsystem::BuildNode::configureAttribute
          (BuildNode *this,ConfigureContext *ctx,StringRef name,ArrayRef<llvm::StringRef> values)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Child local_78;
  uint64_t uStack_70;
  long local_68;
  Child local_58 [2];
  NodeKind local_48;
  char cStack_47;
  undefined6 uStack_46;
  Child local_40;
  NodeKind local_30;
  char cStack_2f;
  undefined6 uStack_2e;
  StringRef local_28;
  
  local_28.Length = name.Length;
  local_28.Data = name.Data;
  if (local_28.Length == 0x15) {
    auVar5[0] = -(local_28.Data[5] == 's');
    auVar5[1] = -(local_28.Data[6] == 'c');
    auVar5[2] = -(local_28.Data[7] == 'a');
    auVar5[3] = -(local_28.Data[8] == 'n');
    auVar5[4] = -(local_28.Data[9] == '-');
    auVar5[5] = -(local_28.Data[10] == 'a');
    auVar5[6] = -(local_28.Data[0xb] == 'f');
    auVar5[7] = -(local_28.Data[0xc] == 't');
    auVar5[8] = -(local_28.Data[0xd] == 'e');
    auVar5[9] = -(local_28.Data[0xe] == 'r');
    auVar5[10] = -(local_28.Data[0xf] == '-');
    auVar5[0xb] = -(local_28.Data[0x10] == 'p');
    auVar5[0xc] = -(local_28.Data[0x11] == 'a');
    auVar5[0xd] = -(local_28.Data[0x12] == 't');
    auVar5[0xe] = -(local_28.Data[0x13] == 'h');
    auVar5[0xf] = -(local_28.Data[0x14] == 's');
    auVar3[0] = -(*local_28.Data == 'm');
    auVar3[1] = -(local_28.Data[1] == 'u');
    auVar3[2] = -(local_28.Data[2] == 's');
    auVar3[3] = -(local_28.Data[3] == 't');
    auVar3[4] = -(local_28.Data[4] == '-');
    auVar3[5] = -(local_28.Data[5] == 's');
    auVar3[6] = -(local_28.Data[6] == 'c');
    auVar3[7] = -(local_28.Data[7] == 'a');
    auVar3[8] = -(local_28.Data[8] == 'n');
    auVar3[9] = -(local_28.Data[9] == '-');
    auVar3[10] = -(local_28.Data[10] == 'a');
    auVar3[0xb] = -(local_28.Data[0xb] == 'f');
    auVar3[0xc] = -(local_28.Data[0xc] == 't');
    auVar3[0xd] = -(local_28.Data[0xd] == 'e');
    auVar3[0xe] = -(local_28.Data[0xe] == 'r');
    auVar3[0xf] = -(local_28.Data[0xf] == '-');
    auVar3 = auVar3 & auVar5;
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
      llbuild::basic::StringList::StringList<llvm::StringRef>((StringList *)local_58,values);
      llbuild::basic::StringList::getValues
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_78,
                 (StringList *)local_58);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::_M_move_assign
                (&this->mustScanAfterPaths,&local_78);
      if (local_78.twine != (Twine *)0x0) {
        operator_delete(local_78.twine,local_68 - (long)local_78);
      }
      goto LAB_0015f153;
    }
  }
  else if ((local_28.Length == 0x1a) &&
          (auVar4[0] = -(local_28.Data[10] == 'c'), auVar4[1] = -(local_28.Data[0xb] == 'l'),
          auVar4[2] = -(local_28.Data[0xc] == 'u'), auVar4[3] = -(local_28.Data[0xd] == 's'),
          auVar4[4] = -(local_28.Data[0xe] == 'i'), auVar4[5] = -(local_28.Data[0xf] == 'o'),
          auVar4[6] = -(local_28.Data[0x10] == 'n'), auVar4[7] = -(local_28.Data[0x11] == '-'),
          auVar4[8] = -(local_28.Data[0x12] == 'p'), auVar4[9] = -(local_28.Data[0x13] == 'a'),
          auVar4[10] = -(local_28.Data[0x14] == 't'), auVar4[0xb] = -(local_28.Data[0x15] == 't'),
          auVar4[0xc] = -(local_28.Data[0x16] == 'e'), auVar4[0xd] = -(local_28.Data[0x17] == 'r'),
          auVar4[0xe] = -(local_28.Data[0x18] == 'n'), auVar4[0xf] = -(local_28.Data[0x19] == 's'),
          auVar2[0] = -(*local_28.Data == 'c'), auVar2[1] = -(local_28.Data[1] == 'o'),
          auVar2[2] = -(local_28.Data[2] == 'n'), auVar2[3] = -(local_28.Data[3] == 't'),
          auVar2[4] = -(local_28.Data[4] == 'e'), auVar2[5] = -(local_28.Data[5] == 'n'),
          auVar2[6] = -(local_28.Data[6] == 't'), auVar2[7] = -(local_28.Data[7] == '-'),
          auVar2[8] = -(local_28.Data[8] == 'e'), auVar2[9] = -(local_28.Data[9] == 'x'),
          auVar2[10] = -(local_28.Data[10] == 'c'), auVar2[0xb] = -(local_28.Data[0xb] == 'l'),
          auVar2[0xc] = -(local_28.Data[0xc] == 'u'), auVar2[0xd] = -(local_28.Data[0xd] == 's'),
          auVar2[0xe] = -(local_28.Data[0xe] == 'i'), auVar2[0xf] = -(local_28.Data[0xf] == 'o'),
          auVar2 = auVar2 & auVar4,
          (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) == 0xffff)) {
    llbuild::basic::StringList::StringList<llvm::StringRef>((StringList *)&local_78,values);
    local_58[0] = local_78;
    if ((Child *)&this->exclusionPatterns != &local_78) {
      (this->exclusionPatterns).size = uStack_70;
      pcVar1 = (this->exclusionPatterns).contents;
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
      }
      (this->exclusionPatterns).contents = (char *)local_78;
      local_78.twine = (Twine *)0x0;
      local_58[0].twine = local_78.twine;
    }
LAB_0015f153:
    if (local_58[0].twine != (Twine *)0x0) {
      operator_delete__(local_58[0].twine);
    }
    return true;
  }
  llvm::Twine::Twine((Twine *)local_58,"unexpected attribute: \'",&local_28);
  llvm::Twine::Twine((Twine *)&local_40,"\'");
  if ((local_48 == NullKind) || (local_30 == NullKind)) {
    local_68 = CONCAT62(local_68._2_6_,0x100);
  }
  else if (local_48 == EmptyKind) {
    local_68 = CONCAT62(uStack_2e,CONCAT11(cStack_2f,local_30));
  }
  else if (local_30 == EmptyKind) {
    local_68 = CONCAT62(uStack_46,CONCAT11(cStack_47,local_48));
  }
  else {
    if (cStack_47 != '\x01') {
      local_48 = TwineKind;
      local_58[0].twine = (Twine *)local_58;
    }
    if (cStack_2f != '\x01') {
      local_30 = TwineKind;
      local_40.twine = (Twine *)&local_40;
    }
    llvm::Twine::Twine((Twine *)&local_78,local_58[0],local_48,local_40,local_30);
  }
  ConfigureContext::error(ctx,(Twine *)&local_78);
  return false;
}

Assistant:

bool BuildNode::configureAttribute(const ConfigureContext& ctx, StringRef name,
                                   ArrayRef<StringRef> values) {
  if (name == "content-exclusion-patterns") {
    exclusionPatterns = basic::StringList(values);
    return true;
  } else if (name == "must-scan-after-paths") {
    mustScanAfterPaths = basic::StringList(values).getValues();
    return true;
  }

  // We don't support any other custom attributes.
  ctx.error("unexpected attribute: '" + name + "'");
  return false;
}